

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

optional_ptr<duckdb::Catalog,_true>
duckdb::Catalog::GetCatalogEntry(CatalogEntryRetriever *retriever,string *catalog_name)

{
  bool bVar1;
  Catalog *pCVar2;
  CatalogEntryRetriever *in_RDI;
  optional_ptr<duckdb::AttachedDatabase,_true> entry;
  DatabaseManager *db_manager;
  ClientContext *context;
  ClientContext *in_stack_00000040;
  DatabaseManager *in_stack_00000048;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  DatabaseManager *this;
  optional_ptr<duckdb::AttachedDatabase,_true> local_30;
  DatabaseManager *local_28;
  ClientContext *local_20;
  optional_ptr<duckdb::Catalog,_true> local_8;
  
  local_20 = CatalogEntryRetriever::GetContext(in_RDI);
  local_28 = DatabaseManager::Get((ClientContext *)0x2a86ab7);
  bVar1 = ::std::operator==<char,_std::char_traits<char>,_std::allocator<char>_>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    ClientData::Get((ClientContext *)0x2a86add);
    shared_ptr<duckdb::AttachedDatabase,_true>::operator->
              ((shared_ptr<duckdb::AttachedDatabase,_true> *)in_stack_ffffffffffffffc0);
    pCVar2 = AttachedDatabase::GetCatalog((AttachedDatabase *)0x2a86af1);
    optional_ptr<duckdb::Catalog,_true>::optional_ptr(&local_8,pCVar2);
  }
  else {
    bVar1 = ::std::operator==<char,_std::char_traits<char>,_std::allocator<char>_>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (bVar1) {
      pCVar2 = GetSystemCatalog((ClientContext *)0x2a86b24);
      optional_ptr<duckdb::Catalog,_true>::optional_ptr(&local_8,pCVar2);
    }
    else {
      this = local_28;
      bVar1 = IsInvalidCatalog((string *)0x2a86b54);
      if (bVar1) {
        GetDefaultCatalog((CatalogEntryRetriever *)0x2a86b64);
      }
      local_30 = DatabaseManager::GetDatabase
                           (in_stack_00000048,in_stack_00000040,(string *)retriever);
      bVar1 = optional_ptr<duckdb::AttachedDatabase,_true>::operator_bool(&local_30);
      if (bVar1) {
        optional_ptr<duckdb::AttachedDatabase,_true>::operator->
                  ((optional_ptr<duckdb::AttachedDatabase,_true> *)this);
        pCVar2 = AttachedDatabase::GetCatalog((AttachedDatabase *)0x2a86bbb);
        optional_ptr<duckdb::Catalog,_true>::optional_ptr(&local_8,pCVar2);
      }
      else {
        optional_ptr<duckdb::Catalog,_true>::optional_ptr(&local_8,(Catalog *)0x0);
      }
    }
  }
  return (optional_ptr<duckdb::Catalog,_true>)local_8.ptr;
}

Assistant:

optional_ptr<Catalog> Catalog::GetCatalogEntry(CatalogEntryRetriever &retriever, const string &catalog_name) {
	auto &context = retriever.GetContext();
	auto &db_manager = DatabaseManager::Get(context);
	if (catalog_name == TEMP_CATALOG) {
		return &ClientData::Get(context).temporary_objects->GetCatalog();
	}
	if (catalog_name == SYSTEM_CATALOG) {
		return &GetSystemCatalog(context);
	}
	auto entry =
	    db_manager.GetDatabase(context, IsInvalidCatalog(catalog_name) ? GetDefaultCatalog(retriever) : catalog_name);
	if (!entry) {
		return nullptr;
	}
	return &entry->GetCatalog();
}